

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  string filename;
  cmGeneratedFileStream fout;
  string local_2a8;
  long *local_288 [2];
  long local_278 [2];
  undefined1 local_268 [584];
  
  pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_288,pcVar1,(allocator *)local_268);
  std::__cxx11::string::append((char *)local_288);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_268,(char *)local_288[0],false);
  if (((byte)(*(_func_int **)(local_268._0_8_ + -0x18))[(long)(local_268 + 0x20)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"{\n\t\"name\": \"",0xc)
    ;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_268,(this->ProjectName)._M_dataplus._M_p,
                        (this->ProjectName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\",\n\t\"directory\": \"",0x12);
    pcVar1 = cmLocalGenerator::GetSourceDirectory(lg);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\",\n\t\"files\": [ { ",0x11);
    GenerateFilesString_abi_cxx11_(&local_2a8,this,lg);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ],\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"}\n",2);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
    const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  this->WriteTargets(lg, fout);
  fout << "}\n";
}